

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.cpp
# Opt level: O2

istream * operator>>(istream *is,half *h)

{
  float f;
  half local_1e;
  float local_1c;
  
  std::istream::_M_extract<float>((float *)is);
  Imath_3_2::half::half(&local_1e,local_1c);
  h->_h = local_1e._h;
  return is;
}

Assistant:

IMATH_EXPORT istream&
operator>> (istream& is, half& h)
{
    float f;
    is >> f;
    h = half (f);
    return is;
}